

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3GenerateIndexKey
              (Parse *pParse,Index *pIdx,int iDataCur,int regOut,int prefixOnly,int *piPartIdxLabel,
              Index *pPrior,int regPrior)

{
  ushort uVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  Parse *in_RDI;
  int in_R8D;
  Vdbe *in_R9;
  long in_stack_00000008;
  int nCol;
  int regBase;
  int j;
  Vdbe *v;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  uint nReg;
  int iVar3;
  uint iTabCur;
  undefined4 uVar4;
  undefined4 uVar5;
  Parse *pParse_00;
  
  pParse_00 = (Parse *)in_RDI->pVdbe;
  uVar5 = 0xaaaaaaaa;
  uVar4 = 0xaaaaaaaa;
  iVar3 = -0x55555556;
  if (in_R9 != (Vdbe *)0x0) {
    if (*(long *)(in_RSI + 0x48) == 0) {
      *(undefined4 *)&in_R9->db = 0;
    }
    else {
      iVar2 = sqlite3VdbeMakeLabel(in_RDI);
      *(int *)&in_R9->db = iVar2;
      in_RDI->iSelfTab = in_EDX + 1;
      sqlite3ExprIfFalseDup(pParse_00,(Expr *)CONCAT44(uVar5,uVar4),iVar3,in_stack_ffffffffffffffc0)
      ;
      in_RDI->iSelfTab = 0;
      in_stack_00000008 = 0;
    }
  }
  if ((in_R8D == 0) || ((*(ushort *)(in_RSI + 99) >> 3 & 1) == 0)) {
    uVar1 = *(ushort *)(in_RSI + 0x60);
  }
  else {
    uVar1 = *(ushort *)(in_RSI + 0x5e);
  }
  nReg = (uint)uVar1;
  iTabCur = nReg;
  iVar3 = sqlite3GetTempRange((Parse *)CONCAT44(uVar5,uVar4),nReg);
  if ((in_stack_00000008 != 0) && ((iVar3 != regBase || (*(long *)(in_stack_00000008 + 0x48) != 0)))
     ) {
    in_stack_00000008 = 0;
  }
  for (iVar2 = 0; iVar2 < (int)iTabCur; iVar2 = iVar2 + 1) {
    if ((((in_stack_00000008 == 0) ||
         (*(short *)(*(long *)(in_stack_00000008 + 8) + (long)iVar2 * 2) !=
          *(short *)(*(long *)(in_RSI + 8) + (long)iVar2 * 2))) ||
        (*(short *)(*(long *)(in_stack_00000008 + 8) + (long)iVar2 * 2) == -2)) &&
       (sqlite3ExprCodeLoadIndexColumn
                  (pParse_00,(Index *)CONCAT44(iVar2,iVar3),iTabCur,nReg,in_stack_ffffffffffffffbc),
       -1 < *(short *)(*(long *)(in_RSI + 8) + (long)iVar2 * 2))) {
      sqlite3VdbeDeletePriorOpcode
                ((Vdbe *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),'\0');
    }
  }
  if (in_ECX != 0) {
    sqlite3VdbeAddOp3(in_R9,(int)((ulong)pParse_00 >> 0x20),(int)pParse_00,iVar2,iVar3);
  }
  sqlite3ReleaseTempRange
            ((Parse *)CONCAT44(iTabCur,nReg),in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3GenerateIndexKey(
  Parse *pParse,       /* Parsing context */
  Index *pIdx,         /* The index for which to generate a key */
  int iDataCur,        /* Cursor number from which to take column data */
  int regOut,          /* Put the new key into this register if not 0 */
  int prefixOnly,      /* Compute only a unique prefix of the key */
  int *piPartIdxLabel, /* OUT: Jump to this label to skip partial index */
  Index *pPrior,       /* Previously generated index key */
  int regPrior         /* Register holding previous generated key */
){
  Vdbe *v = pParse->pVdbe;
  int j;
  int regBase;
  int nCol;

  if( piPartIdxLabel ){
    if( pIdx->pPartIdxWhere ){
      *piPartIdxLabel = sqlite3VdbeMakeLabel(pParse);
      pParse->iSelfTab = iDataCur + 1;
      sqlite3ExprIfFalseDup(pParse, pIdx->pPartIdxWhere, *piPartIdxLabel,
                            SQLITE_JUMPIFNULL);
      pParse->iSelfTab = 0;
      pPrior = 0; /* Ticket a9efb42811fa41ee 2019-11-02;
                  ** pPartIdxWhere may have corrupted regPrior registers */
    }else{
      *piPartIdxLabel = 0;
    }
  }
  nCol = (prefixOnly && pIdx->uniqNotNull) ? pIdx->nKeyCol : pIdx->nColumn;
  regBase = sqlite3GetTempRange(pParse, nCol);
  if( pPrior && (regBase!=regPrior || pPrior->pPartIdxWhere) ) pPrior = 0;
  for(j=0; j<nCol; j++){
    if( pPrior
     && pPrior->aiColumn[j]==pIdx->aiColumn[j]
     && pPrior->aiColumn[j]!=XN_EXPR
    ){
      /* This column was already computed by the previous index */
      continue;
    }
    sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iDataCur, j, regBase+j);
    if( pIdx->aiColumn[j]>=0 ){
      /* If the column affinity is REAL but the number is an integer, then it
      ** might be stored in the table as an integer (using a compact
      ** representation) then converted to REAL by an OP_RealAffinity opcode.
      ** But we are getting ready to store this value back into an index, where
      ** it should be converted by to INTEGER again.  So omit the
      ** OP_RealAffinity opcode if it is present */
      sqlite3VdbeDeletePriorOpcode(v, OP_RealAffinity);
    }
  }
  if( regOut ){
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase, nCol, regOut);
  }
  sqlite3ReleaseTempRange(pParse, regBase, nCol);
  return regBase;
}